

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputparser.cpp
# Opt level: O3

void __thiscall ObjectParser::parseLine(ObjectParser *this,string *line,int section)

{
  char cVar1;
  Network *pNVar2;
  bool bVar3;
  int iVar4;
  InputError *pIVar5;
  ulong uVar6;
  ulong uVar7;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  string s2;
  string s1;
  
  s2.field_2._8_8_ = &s1._M_string_length;
  s1._M_dataplus._M_p = (pointer)0x0;
  s1._M_string_length._0_1_ = 0;
  local_70 = (undefined1  [8])&s2._M_string_length;
  s2._M_dataplus._M_p = (pointer)0x0;
  s2._M_string_length._0_1_ = 0;
  if ((this->super_InputParser).network != (Network *)0x0) {
    uVar6 = line->_M_string_length;
    if (uVar6 == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      do {
        cVar1 = (line->_M_dataplus)._M_p[uVar7];
        if ((cVar1 == '\t') || (cVar1 == ' ')) {
          if (s1._M_dataplus._M_p != (pointer)0x0) break;
        }
        else {
          std::__cxx11::string::push_back((char)&s2 + '\x18');
          uVar6 = line->_M_string_length;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar6);
      uVar7 = uVar7 & 0xffffffff;
    }
    switch(section) {
    case 1:
      iVar4 = Network::indexOf((this->super_InputParser).network,NODE,
                               (string *)((long)&s2.field_2 + 8));
      if (-1 < iVar4) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_350,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
        InputError::InputError(pIVar5,4,&local_350);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      pNVar2 = (this->super_InputParser).network;
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
      bVar3 = Network::addElement(pNVar2,NODE,0,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if (!bVar3) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_330,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
        InputError::InputError(pIVar5,1,&local_330);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      break;
    case 2:
      iVar4 = Network::indexOf((this->super_InputParser).network,NODE,
                               (string *)((long)&s2.field_2 + 8));
      if (-1 < iVar4) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_310,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
        InputError::InputError(pIVar5,4,&local_310);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      pNVar2 = (this->super_InputParser).network;
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
      bVar3 = Network::addElement(pNVar2,NODE,2,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if (!bVar3) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
        InputError::InputError(pIVar5,1,&local_2f0);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      break;
    case 3:
      iVar4 = Network::indexOf((this->super_InputParser).network,NODE,
                               (string *)((long)&s2.field_2 + 8));
      if (-1 < iVar4) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d0,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
        InputError::InputError(pIVar5,4,&local_2d0);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      pNVar2 = (this->super_InputParser).network;
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
      bVar3 = Network::addElement(pNVar2,NODE,1,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if (!bVar3) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b0,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
        InputError::InputError(pIVar5,1,&local_2b0);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      break;
    case 4:
      iVar4 = Network::indexOf((this->super_InputParser).network,LINK,
                               (string *)((long)&s2.field_2 + 8));
      if (-1 < iVar4) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_290,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
        InputError::InputError(pIVar5,4,&local_290);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      pNVar2 = (this->super_InputParser).network;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
      bVar3 = Network::addElement(pNVar2,LINK,0,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if (!bVar3) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
        InputError::InputError(pIVar5,1,&local_270);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      break;
    case 5:
      iVar4 = Network::indexOf((this->super_InputParser).network,LINK,
                               (string *)((long)&s2.field_2 + 8));
      if (-1 < iVar4) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_250,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
        InputError::InputError(pIVar5,4,&local_250);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      pNVar2 = (this->super_InputParser).network;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
      bVar3 = Network::addElement(pNVar2,LINK,1,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if (!bVar3) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_230,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
        InputError::InputError(pIVar5,1,&local_230);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      break;
    case 6:
      iVar4 = Network::indexOf((this->super_InputParser).network,LINK,
                               (string *)((long)&s2.field_2 + 8));
      if (-1 < iVar4) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
        InputError::InputError(pIVar5,4,&local_210);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      pNVar2 = (this->super_InputParser).network;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
      bVar3 = Network::addElement(pNVar2,LINK,2,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if (!bVar3) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f0,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
        InputError::InputError(pIVar5,1,&local_1f0);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      break;
    case 7:
      iVar4 = Network::indexOf((this->super_InputParser).network,PATTERN,
                               (string *)((long)&s2.field_2 + 8));
      if (iVar4 < 0) {
        uVar6 = line->_M_string_length;
        if (uVar7 < uVar6) {
          do {
            cVar1 = (line->_M_dataplus)._M_p[uVar7];
            if ((cVar1 == '\t') || (cVar1 == ' ')) {
              if (s2._M_dataplus._M_p != (pointer)0x0) break;
            }
            else {
              std::__cxx11::string::push_back((char)local_70);
              uVar6 = line->_M_string_length;
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < uVar6);
        }
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"VARIABLE","");
        bVar3 = Utilities::match((string *)local_70,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        pNVar2 = (this->super_InputParser).network;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
        bVar3 = Network::addElement(pNVar2,PATTERN,(uint)bVar3,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if (!bVar3) {
          pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d0,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
          InputError::InputError(pIVar5,1,&local_1d0);
          __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
        }
      }
      break;
    case 8:
      iVar4 = Network::indexOf((this->super_InputParser).network,CURVE,
                               (string *)((long)&s2.field_2 + 8));
      if (iVar4 < 0) {
        pNVar2 = (this->super_InputParser).network;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
        bVar3 = Network::addElement(pNVar2,CURVE,0,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if (!bVar3) {
          pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b0,s2.field_2._8_8_,s1._M_dataplus._M_p + s2.field_2._8_8_);
          InputError::InputError(pIVar5,1,&local_1b0);
          __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
        }
      }
    }
  }
  if (local_70 != (undefined1  [8])&s2._M_string_length) {
    operator_delete((void *)local_70);
  }
  if ((size_type *)s2.field_2._8_8_ != &s1._M_string_length) {
    operator_delete((void *)s2.field_2._8_8_);
  }
  return;
}

Assistant:

void ObjectParser::parseLine(string& line, int section)
{
    string s1;
    string s2;
    int    type = 0;

    // ... read first string token from input line

    if (network == 0) return;
    int i = 0;
    for (; i < line.length(); i++)
    {
        char chLine = line[i];
        if (chLine == ' ' || chLine == '\t')
        {
            if (s1.empty())
                continue;
            else
                break;
        }
        else
        {
            s1 += chLine;
        }
    }

    // ... create new object whose type is determined by current file section

    switch(section)
    {
    case InputReader::JUNCTION:
        if ( network->indexOf(Element::NODE, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::NODE, Node::JUNCTION, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::RESERVOIR:
        if ( network->indexOf(Element::NODE, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::NODE, Node::RESERVOIR, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::TANK:
        if ( network->indexOf(Element::NODE, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::NODE, Node::TANK, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::PIPE:
        if ( network->indexOf(Element::LINK, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::LINK, Link::PIPE, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::PUMP:
        if ( network->indexOf(Element::LINK, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::LINK, Link::PUMP, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::VALVE:
        if ( network->indexOf(Element::LINK, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::LINK, Link::VALVE, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::PATTERN:
        // Check if pattern already created
        if ( network->indexOf(Element::PATTERN, s1 ) >= 0) break;

        // Check if pattern is Fixed or Variable
        for (; i < line.length(); i++)
        {
            char chLine = line[i];
            if (chLine == ' ' || chLine == '\t')
            {
                if (s2.empty())
                    continue;
                else
                    break;
            }
            else
            {
                s2 += chLine;
            }
        }
        type = Pattern::FIXED_PATTERN;
        if (Utilities::match(s2, w_Variable)) type = Pattern::VARIABLE_PATTERN;

        if ( !network->addElement(Element::PATTERN, type, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::CURVE:
        // Check if curve already created
        if ( network->indexOf(Element::CURVE, s1) >= 0 ) break;
        if ( !network->addElement(Element::CURVE, 0, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

/*
    case InputReader::RULE:
        // Check for Rule keyword
        if (Utilities::match(s1, w_Rule))
        {
            // Parse rule's name
            sin >> s2;
            if (sin.fail()) return InputError::TOO_FEW_ITEMS;

            // Check if rule with same name already exists
            if (network->indexOf(Element::CONTROL, s2) >= 0)
                return InputError::DUPLICATE_ID;

            // Add new rule
            network->addElement(Element::CONTROL, s2);
        }
        break;
*/
    }
}